

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

void slang::ast::Statement::bindScopeInitializers
               (ASTContext *context,SmallVectorBase<const_slang::ast::Statement_*> *results)

{
  Scope *this;
  Compilation *this_00;
  iterator args;
  Symbol *member;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar1;
  SourceRange range;
  VariableDeclStatement *local_48;
  SourceRange local_40;
  
  this = (context->scope).ptr;
  this_00 = this->compilation;
  sVar1 = Scope::members(this);
  for (args = sVar1._M_begin.current; args.current != sVar1._M_end.current.current;
      args.current = (((VariableSymbol *)args.current)->super_ValueSymbol).super_Symbol.nextInScope)
  {
    if (((((VariableSymbol *)args.current)->super_ValueSymbol).super_Symbol.kind == Variable) &&
       (((((VariableSymbol *)args.current)->flags).m_bits & 2) == 0)) {
      local_40.startLoc =
           (((VariableSymbol *)args.current)->super_ValueSymbol).super_Symbol.location;
      local_40.endLoc =
           (SourceLocation)
           ((((VariableSymbol *)args.current)->super_ValueSymbol).super_Symbol.name._M_len *
            0x10000000 + (long)local_40.startLoc);
      local_48 = BumpAllocator::
                 emplace<slang::ast::VariableDeclStatement,slang::ast::VariableSymbol_const&,slang::SourceRange&>
                           (&this_00->super_BumpAllocator,(VariableSymbol *)args.current,&local_40);
      SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                ((SmallVectorBase<slang::ast::Statement_const*> *)results,(Statement **)&local_48);
    }
  }
  return;
}

Assistant:

void Statement::bindScopeInitializers(const ASTContext& context,
                                      SmallVectorBase<const Statement*>& results) {
    // This relies on the language requiring all declarations be at the
    // start of a statement block. Additional work would be required to
    // support declarations anywhere in the block, because as written all
    // of the initialization will happen at the start of the block, which
    // might have different side-effects than if they were initialized in
    // the middle somewhere. The parser currently enforces this for us.
    auto& scope = *context.scope;
    auto& comp = scope.getCompilation();
    for (auto& member : scope.members()) {
        if (member.kind != SymbolKind::Variable)
            continue;

        // Filter out implicitly generated function return type variables -- they are
        // initialized elsewhere. Note that we manufacture a somewhat reasonable
        // source range here, since we don't have the real one.
        auto& var = member.as<VariableSymbol>();
        if (!var.flags.has(VariableFlags::CompilerGenerated)) {
            SourceRange range{var.location, var.location + var.name.length()};
            results.push_back(comp.emplace<VariableDeclStatement>(var, range));
        }
    }
}